

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::LoadCache(cmake *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string cacheFile;
  string local_68;
  char *local_48;
  undefined8 local_40;
  string local_38;
  
  psVar3 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  bVar1 = LoadCache(this,psVar3);
  if (!bVar1) {
    psVar3 = cmState::GetBinaryDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_68._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
    local_68.field_2._M_allocated_capacity = 0;
    local_68.field_2._8_8_ = 0xf;
    local_48 = "/CMakeCache.txt";
    local_40 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_68;
    cmCatViews(&local_38,views);
    bVar1 = cmsys::SystemTools::FileExists(&local_38);
    if (bVar1) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "There is a CMakeCache.txt file for the current binary tree but cmake does not have permission to read it. Please check the permissions of the directory you are trying to run CMake on."
                 ,"");
      cmSystemTools::Error(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      return -1;
    }
  }
  iVar2 = AddCMakePaths(this);
  return iVar2 * 3 + -3;
}

Assistant:

int cmake::LoadCache()
{
  // could we not read the cache
  if (!this->LoadCache(this->GetHomeOutputDirectory())) {
    // if it does exist, but isn't readable then warn the user
    std::string cacheFile =
      cmStrCat(this->GetHomeOutputDirectory(), "/CMakeCache.txt");
    if (cmSystemTools::FileExists(cacheFile)) {
      cmSystemTools::Error(
        "There is a CMakeCache.txt file for the current binary tree but "
        "cmake does not have permission to read it. Please check the "
        "permissions of the directory you are trying to run CMake on.");
      return -1;
    }
  }

  // setup CMAKE_ROOT and CMAKE_COMMAND
  if (!this->AddCMakePaths()) {
    return -3;
  }
  return 0;
}